

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFUnit.cpp
# Opt level: O2

Optional<unsigned_long> __thiscall
llvm::DWARFUnit::getStringOffsetSectionItem(DWARFUnit *this,uint32_t Index)

{
  byte bVar1;
  uint64_t uVar2;
  anon_union_8_2_fc7899a5_for_OptionalStorage<unsigned_long,_true>_2 aVar3;
  undefined8 extraout_RDX;
  undefined8 uVar4;
  Optional<unsigned_long> OVar5;
  undefined1 local_50 [8];
  DWARFDataExtractor DA;
  uint64_t Offset;
  
  if ((this->StringOffsetsTableContribution).Storage.hasVal == true) {
    bVar1 = getDwarfStringOffsetsByteSize(this);
    uVar2 = getStringOffsetsBase(this);
    DA.Section = (DWARFSection *)(Index * bVar1 + uVar2);
    DA.Obj = (DWARFObject *)this->StringOffsetSection;
    DA.super_DataExtractor.Data.Data = ((DA.Obj)->Dummy).Data.Data;
    if (DA.super_DataExtractor.Data.Data < (char *)((long)&((DA.Section)->Data).Data + (ulong)bVar1)
       ) {
      uVar4 = 0;
      aVar3.value = 0;
    }
    else {
      DA.super_DataExtractor._16_8_ =
           (this->Context->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
      DA.super_DataExtractor.Data.Length._0_1_ = this->isLittleEndian;
      local_50 = (undefined1  [8])((StringRef *)&(DA.Obj)->_vptr_DWARFObject)->Data;
      DA.super_DataExtractor.Data.Length._1_1_ = 0;
      aVar3.value = DWARFDataExtractor::getRelocatedValue
                              ((DWARFDataExtractor *)local_50,(uint)bVar1,(uint64_t *)&DA.Section,
                               (uint64_t *)0x0,(Error *)0x0);
      uVar4 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
    }
    OVar5.Storage._8_8_ = uVar4;
    OVar5.Storage.field_0.value = aVar3.value;
    return (Optional<unsigned_long>)OVar5.Storage;
  }
  return (OptionalStorage<unsigned_long,_true>)ZEXT816(0);
}

Assistant:

Optional<uint64_t> DWARFUnit::getStringOffsetSectionItem(uint32_t Index) const {
  if (!StringOffsetsTableContribution)
    return None;
  unsigned ItemSize = getDwarfStringOffsetsByteSize();
  uint64_t Offset = getStringOffsetsBase() + Index * ItemSize;
  if (StringOffsetSection.Data.size() < Offset + ItemSize)
    return None;
  DWARFDataExtractor DA(Context.getDWARFObj(), StringOffsetSection,
                        isLittleEndian, 0);
  return DA.getRelocatedValue(ItemSize, &Offset);
}